

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QtPromise::QPromiseCanceledException>
          (PromiseError *this,QPromiseCanceledException *value)

{
  QPromiseCanceledException *this_00;
  QPromiseCanceledException *value_local;
  PromiseError *this_local;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&this->m_data);
  this_00 = (QPromiseCanceledException *)__cxa_allocate_exception(8);
  QtPromise::QPromiseCanceledException::QPromiseCanceledException(this_00,value);
  __cxa_throw(this_00,&QtPromise::QPromiseCanceledException::typeinfo,
              QtPromise::QPromiseCanceledException::~QPromiseCanceledException);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }